

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O1

void __thiscall
MILBlob::Blob::FileWriter::FileWriter(FileWriter *this,string *filePath,bool truncateFile)

{
  runtime_error *this_00;
  long *plVar1;
  long *plVar2;
  _Ios_Openmode _Var3;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::fstream::fstream(this);
  _Var3 = (_Ios_Openmode)filePath;
  std::fstream::open((string *)this,_Var3);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) != 0) {
    std::fstream::open((string *)this,_Var3);
    std::fstream::close();
    std::fstream::open((string *)this,_Var3);
  }
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"[MIL FileWriter]: Unable to open ",filePath);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_68 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_68 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileWriter::FileWriter(const std::string& filePath, bool truncateFile)
{
    m_fileStream.open(filePath, GetWriterMode(truncateFile));
    if (!m_fileStream) {
        // If file does not exists, ios::in does not create one
        // Let's create a file and re-open with required flags
        m_fileStream.open(filePath, std::ofstream::binary | std::ios::out);
        m_fileStream.close();
        m_fileStream.open(filePath, GetWriterMode(truncateFile));
    }
    MILVerifyIsTrue(m_fileStream,
                    std::runtime_error,
                    "[MIL FileWriter]: Unable to open " + filePath + " file stream for writing");
}